

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O3

void __thiscall TreeModel::setFixed(TreeModel *this,UModelIndex *index,bool fixed)

{
  TreeModel *this_00;
  uint64_t uVar1;
  long lVar2;
  UModelIndex UStack_28;
  
  this_00 = index->m;
  if (this_00 != (TreeModel *)0x0 && -1 < (index->c | index->r)) {
    uVar1 = index->i;
    *(bool *)(uVar1 + 200) = fixed;
    lVar2 = *(long *)(uVar1 + 0x110);
    if (lVar2 != 0 && fixed) {
      if ((*(char *)(uVar1 + 0xc9) == '\x01') && (*(char *)(lVar2 + 0xc9) == '\0')) {
        *(undefined1 *)(uVar1 + 200) = *(undefined1 *)(lVar2 + 200);
      }
      else {
        parent(&UStack_28,this_00,index);
        setFixed(this,&UStack_28,true);
      }
    }
  }
  return;
}

Assistant:

void TreeModel::setFixed(const UModelIndex &index, const bool fixed)
{
    if (!index.isValid())
        return;
    
    TreeItem *item = static_cast<TreeItem*>(index.internalPointer());
    item->setFixed(fixed);
    
    if (!item->parent())
        return;
    
    if (fixed) {
        // Special handling for uncompressed to compressed boundary
        if (item->compressed() && item->parent()->compressed() == FALSE) {
            item->setFixed(item->parent()->fixed());
            return;
        }
        
        // Propagate fixed flag until root
        setFixed(index.parent(), true);
    }
    
    emit dataChanged(index, index);
}